

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

void __thiscall PFloat::SetSymbols(PFloat *this,SymbolInitI *sym,size_t count)

{
  undefined8 in_RAX;
  PSymbolConstNumeric *this_00;
  size_t sVar1;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  for (sVar1 = 0; count != sVar1; sVar1 = sVar1 + 1) {
    this_00 = (PSymbolConstNumeric *)DObject::operator_new(0x38);
    uStack_38 = CONCAT44(sym[sVar1].Name,(undefined4)uStack_38);
    PSymbolConstNumeric::PSymbolConstNumeric
              (this_00,(FName *)((long)&uStack_38 + 4),(PType *)this,sym[sVar1].Value);
    PSymbolTable::AddSymbol(&(this->super_PBasicType).super_PType.Symbols,(PSymbol *)this_00);
  }
  return;
}

Assistant:

void PFloat::SetSymbols(const PFloat::SymbolInitI *sym, size_t count)
{
	for (size_t i = 0; i < count; ++i)
	{
		Symbols.AddSymbol(new PSymbolConstNumeric(sym[i].Name, this, sym[i].Value));
	}
}